

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver6L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *__return_storage_ptr__,
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                       *plPair,
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                      *lCPair)

{
  float fVar1;
  float fVar2;
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  DenseStorage<float,_6,_6,_1,_0> *pDVar27;
  float *pfVar28;
  uint iter;
  long lVar29;
  int r;
  long lVar30;
  bool bVar31;
  Scalar SVar32;
  float fVar33;
  float fVar34;
  undefined8 uVar35;
  float fVar36;
  float fVar37;
  Matrix<float,_3,_1,_0,_3,_1> R62_B;
  Matrix<float,_3,_1,_0,_3,_1> R61_B;
  Matrix<float,_3,_1,_0,_3,_1> Q62;
  Matrix<float,_3,_1,_0,_3,_1> Q61;
  Matrix<float,_3,_1,_0,_3,_1> R52_B;
  Matrix<float,_3,_1,_0,_3,_1> R51_B;
  Matrix<float,_3,_1,_0,_3,_1> Q52;
  Matrix<float,_3,_1,_0,_3,_1> Q51;
  Matrix<float,_3,_1,_0,_3,_1> R42_B;
  Matrix<float,_3,_1,_0,_3,_1> R41_B;
  Matrix<float,_3,_1,_0,_3,_1> Q42;
  Matrix<float,_3,_1,_0,_3,_1> Q41;
  Matrix<float,_3,_1,_0,_3,_1> R32_B;
  Matrix<float,_3,_1,_0,_3,_1> R31_B;
  Matrix<float,_3,_1,_0,_3,_1> Q32;
  Matrix<float,_3,_1,_0,_3,_1> Q31;
  Matrix<float,_3,_1,_0,_3,_1> R22_B;
  Matrix<float,_3,_1,_0,_3,_1> R21_B;
  Matrix<float,_3,_1,_0,_3,_1> Q22;
  Matrix<float,_3,_1,_0,_3,_1> Q21;
  Matrix<float,_3,_1,_0,_3,_1> R12_B;
  Matrix<float,_3,_1,_0,_3,_1> R11_B;
  Matrix<float,_3,_3,_0,_3,_3> RotationEstimate;
  Matrix<float,_6,_1,_0,_6,_1> L61;
  Matrix<float,_6,_1,_0,_6,_1> L52;
  Matrix<float,_6,_1,_0,_6,_1> L51;
  Matrix<float,_6,_1,_0,_6,_1> L42;
  Matrix<float,_6,_1,_0,_6,_1> L41;
  Matrix<float,_6,_1,_0,_6,_1> L32;
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  Matrix<float,_6,_6,_0,_6,_6> L1;
  Matrix<float,_3,_1,_0,_3,_1> Q12;
  Matrix<float,_3,_1,_0,_3,_1> Q11;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L1vec;
  Matrix<float,_6,_1,_0,_6,_1> L62;
  Matrix<float,_4,_4,_0,_4,_4> TransformationEstimate;
  Matrix<float,_6,_6,_0,_6,_6> L2;
  SrcEvaluatorType srcEvaluator;
  Matrix<float,_3,_1,_0,_3,_1> solution;
  SrcEvaluatorType srcEvaluator_12;
  Matrix<float,_6,_1,_0,_6,_1> k;
  Matrix<float,_6,_3,_0,_6,_3> A;
  Matrix<float,_64,_64,_0,_64,_64> Action;
  EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> Eig;
  Matrix<std::complex<float>,_64,_64,_0,_64,_64> EV;
  assign_op<float,_float> aStack_20d35;
  undefined1 auStack_20d34 [16];
  float fStack_20d24;
  float fStack_20d20;
  undefined1 auStack_20d1c [16];
  float fStack_20d0c;
  float fStack_20d08;
  undefined1 auStack_20d04 [16];
  float fStack_20cf4;
  float fStack_20cf0;
  undefined1 auStack_20cec [16];
  float fStack_20cdc;
  float fStack_20cd8;
  undefined1 auStack_20cd4 [16];
  float fStack_20cc4;
  float fStack_20cc0;
  undefined1 auStack_20cbc [16];
  float fStack_20cac;
  float fStack_20ca8;
  undefined1 auStack_20ca4 [16];
  float fStack_20c94;
  float fStack_20c90;
  undefined1 auStack_20c8c [16];
  float fStack_20c7c;
  float fStack_20c78;
  undefined1 auStack_20c74 [16];
  float fStack_20c64;
  float fStack_20c60;
  undefined1 auStack_20c5c [16];
  float fStack_20c4c;
  float fStack_20c48;
  undefined1 auStack_20c44 [16];
  float fStack_20c34;
  float fStack_20c30;
  Matrix<float,_3,_3,_0,_3,_3> MStack_20c2c;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20c08;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20be8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20bc8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20ba8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b88;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b68;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b48;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b28;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b08;
  undefined1 auStack_20ae8 [16];
  float fStack_20ad8;
  float fStack_20ad4;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20ac8;
  undefined1 auStack_20aac [8];
  undefined1 auStack_20aa4 [8];
  undefined1 auStack_20a9c [4];
  undefined1 auStack_20a98 [16];
  float fStack_20a88;
  float fStack_20a84;
  float afStack_20a80 [2];
  float afStack_20a78 [2];
  float fStack_20a70;
  float fStack_20a6c;
  float afStack_20a68 [2];
  float afStack_20a60 [2];
  float fStack_20a58;
  float fStack_20a54;
  float afStack_20a50 [2];
  float afStack_20a48 [2];
  float fStack_20a40;
  float fStack_20a3c;
  float afStack_20a38 [2];
  float afStack_20a30 [2];
  float fStack_20a28;
  float fStack_20a24;
  undefined1 auStack_20a20 [16];
  float fStack_20a10;
  float fStack_20a0c;
  undefined1 auStack_20a00 [16];
  float fStack_209f0;
  float fStack_209ec;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  vStack_209e8;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  vStack_209c8;
  undefined1 auStack_209a8 [16];
  float fStack_20998;
  float fStack_20994;
  undefined1 auStack_20988 [64];
  Matrix<float,_6,_6,_0,_6,_6> MStack_20948;
  undefined1 auStack_208b0 [8];
  undefined1 auStack_208a8 [8];
  undefined8 uStack_208a0;
  undefined8 uStack_20898;
  PointerType pfStack_20890;
  XprTypeNested pMStack_20880;
  variable_if_dynamic<long,__1> vStack_20878;
  variable_if_dynamic<long,__1> vStack_20870;
  Index IStack_20868;
  variable_if_dynamic<long,__1> vStack_20860;
  Index IStack_20850;
  Matrix<float,_3,_3,_0,_3,_3> *pMStack_20848;
  PointerType pfStack_20840;
  variable_if_dynamic<long,__1> vStack_20838;
  PointerType pfStack_20828;
  Matrix<float,_6,_6,_0,_6,_6> *pMStack_20818;
  variable_if_dynamic<long,__1> vStack_20810;
  variable_if_dynamic<long,__1> vStack_20808;
  Index IStack_20800;
  variable_if_dynamic<long,__1> vStack_207f8;
  Index IStack_207e8;
  PointerType pfStack_207e0;
  variable_if_dynamic<long,__1> vStack_207d8;
  PointerType pfStack_207c8;
  XprTypeNested pMStack_207b8;
  variable_if_dynamic<long,__1> vStack_207b0;
  variable_if_dynamic<long,__1> vStack_207a8;
  Index IStack_207a0;
  variable_if_dynamic<long,__1> vStack_20798;
  Index IStack_20788;
  Matrix<float,_3,_3,_0,_3,_3> *pMStack_20780;
  PointerType pfStack_20778;
  variable_if_dynamic<long,__1> vStack_20770;
  PointerType pfStack_20760;
  Matrix<float,_6,_6,_0,_6,_6> *pMStack_20750;
  variable_if_dynamic<long,__1> vStack_20748;
  variable_if_dynamic<long,__1> vStack_20740;
  Index IStack_20738;
  variable_if_dynamic<long,__1> vStack_20730;
  Index IStack_20720;
  Matrix<float,_3,_1,_0,_3,_1> MStack_20704;
  undefined1 auStack_206f8 [16];
  float *pfStack_206e8;
  float *pfStack_206d8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_206c8;
  Matrix<float,_6,_3,_0,_6,_3> MStack_206b0;
  Matrix<float,_64,_64,_0,_64,_64> MStack_20668;
  undefined1 auStack_1c668 [8];
  variable_if_dynamic<long,__1> vStack_1c660;
  undefined8 uStack_1c658;
  Matrix<float,_6,_1,_0,_6,_1> *pMStack_1c650;
  undefined1 auStack_1c648 [16];
  Index IStack_1c638;
  undefined1 auStack_18668 [50448];
  bool local_c158;
  undefined2 local_c144;
  Index local_c140;
  EigenvectorsType local_8038;
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar28 = *(float **)lPair;
  auStack_20a00._12_4_ = *pfVar28;
  uStack_208a0 = (non_const_type)(auStack_20a00 + 0xc);
  fStack_209f0 = pfVar28[1];
  fStack_209ec = pfVar28[2];
  auStack_20a00._0_4_ = pfVar28[4];
  auStack_208a8 = (undefined1  [8])auStack_20a00;
  auStack_20a00._4_4_ = pfVar28[5];
  auStack_20a00._8_4_ = pfVar28[6];
  auStack_20c44._12_4_ = pfVar28[8];
  fStack_20c34 = pfVar28[9];
  fStack_20c30 = pfVar28[10];
  auStack_20c44._0_4_ = pfVar28[0xc];
  auStack_20c44._4_4_ = pfVar28[0xd];
  auStack_20c44._8_4_ = pfVar28[0xe];
  auStack_20c5c._12_4_ = pfVar28[0x10];
  fStack_20c4c = pfVar28[0x11];
  fStack_20c48 = pfVar28[0x12];
  auStack_20c5c._0_4_ = pfVar28[0x14];
  auStack_20c5c._4_4_ = pfVar28[0x15];
  auStack_20c5c._8_4_ = pfVar28[0x16];
  auStack_20c74._12_4_ = pfVar28[0x18];
  fStack_20c64 = pfVar28[0x19];
  fStack_20c60 = pfVar28[0x1a];
  auStack_20c74._0_4_ = pfVar28[0x1c];
  auStack_20c74._4_4_ = pfVar28[0x1d];
  auStack_20c74._8_4_ = pfVar28[0x1e];
  auStack_20c8c._12_4_ = pfVar28[0x20];
  fStack_20c7c = pfVar28[0x21];
  fStack_20c78 = pfVar28[0x22];
  auStack_20c8c._0_4_ = pfVar28[0x24];
  auStack_20c8c._4_4_ = pfVar28[0x25];
  auStack_20c8c._8_4_ = pfVar28[0x26];
  auStack_20ca4._12_4_ = pfVar28[0x28];
  fStack_20c94 = pfVar28[0x29];
  fStack_20c90 = pfVar28[0x2a];
  auStack_20ca4._0_4_ = pfVar28[0x2c];
  auStack_20ca4._4_4_ = pfVar28[0x2d];
  auStack_20ca4._8_4_ = pfVar28[0x2e];
  auStack_20cbc._12_4_ = pfVar28[0x30];
  fStack_20cac = pfVar28[0x31];
  fStack_20ca8 = pfVar28[0x32];
  auStack_20cbc._0_4_ = pfVar28[0x34];
  auStack_20cbc._4_4_ = pfVar28[0x35];
  auStack_20cbc._8_4_ = pfVar28[0x36];
  auStack_20cd4._12_4_ = pfVar28[0x38];
  fStack_20cc4 = pfVar28[0x39];
  fStack_20cc0 = pfVar28[0x3a];
  auStack_20cd4._0_4_ = pfVar28[0x3c];
  auStack_20cd4._4_4_ = pfVar28[0x3d];
  auStack_20cd4._8_4_ = pfVar28[0x3e];
  auStack_20cec._12_4_ = pfVar28[0x40];
  fStack_20cdc = pfVar28[0x41];
  fStack_20cd8 = pfVar28[0x42];
  auStack_20cec._0_4_ = pfVar28[0x44];
  auStack_20cec._4_4_ = pfVar28[0x45];
  auStack_20cec._8_4_ = pfVar28[0x46];
  auStack_20d04._12_4_ = pfVar28[0x48];
  fStack_20cf4 = pfVar28[0x49];
  fStack_20cf0 = pfVar28[0x4a];
  auStack_20d04._0_4_ = pfVar28[0x4c];
  auStack_20d04._4_4_ = pfVar28[0x4d];
  auStack_20d04._8_4_ = pfVar28[0x4e];
  auStack_20d1c._12_4_ = pfVar28[0x50];
  fStack_20d0c = pfVar28[0x51];
  fStack_20d08 = pfVar28[0x52];
  auStack_20d1c._0_4_ = pfVar28[0x54];
  auStack_20d1c._4_4_ = pfVar28[0x55];
  auStack_20d1c._8_4_ = pfVar28[0x56];
  auStack_20d34._12_4_ = pfVar28[0x58];
  fStack_20d24 = pfVar28[0x59];
  fStack_20d20 = pfVar28[0x5a];
  auStack_20d34._0_4_ = pfVar28[0x5c];
  auStack_20d34._4_4_ = pfVar28[0x5d];
  auStack_20d34._8_4_ = pfVar28[0x5e];
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[2] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[3] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[4] = 1.4013e-45;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[5] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[6] = 4.2039e-45;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[7] = 0.0;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
  vStack_1c660.m_value = 3;
  uStack_1c658 = 1;
  auStack_1c648 = ZEXT816(0);
  IStack_1c638 = 6;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
  auStack_20a98._0_8_ = &MStack_20ac8;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array._0_8_ = &MStack_20ac8;
  auStack_1c668 = (undefined1  [8])&MStack_20ac8;
  pMStack_1c650 = &MStack_20ac8;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)&local_8038);
  auStack_1c668._4_4_ =
       fStack_209ec * (float)auStack_20a00._0_4_ -
       (float)auStack_20a00._8_4_ * (float)auStack_20a00._12_4_;
  auStack_1c668._0_4_ =
       fStack_209f0 * (float)auStack_20a00._8_4_ - (float)auStack_20a00._4_4_ * fStack_209ec;
  vStack_1c660.m_value._0_4_ =
       (float)auStack_20a00._12_4_ * (float)auStack_20a00._4_4_ -
       (float)auStack_20a00._0_4_ * fStack_209f0;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
  if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data
       .array._24_8_ +
       MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data
       .array._8_8_ == 6) &&
     (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array._16_8_ == 1)) {
    vStack_1c660.m_value = 3;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auStack_1c648._8_8_;
    auStack_1c648 = auVar15 << 0x40;
    IStack_1c638 = 6;
    auStack_1c668 = (undefined1  [8])&MStack_20ac8;
    pMStack_1c650 = &MStack_20ac8;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20ac8;
    SVar32 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                         *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)auStack_1c668);
    fVar33 = SQRT(SVar32);
    auVar3._4_4_ = fVar33;
    auVar3._0_4_ = fVar33;
    auVar3._8_4_ = fVar33;
    auVar3._12_4_ = fVar33;
    MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
    _0_16_ = divps((undefined1  [16])
                   MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array._0_16_,auVar3);
    MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
    [4] = MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[4] / fVar33;
    MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
    [5] = MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[5] / fVar33;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[2] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[3] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[4] = 1.4013e-45;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[5] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[6] = 4.2039e-45;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[7] = 0.0;
    vStack_1c660.m_value = 3;
    uStack_1c658 = 1;
    auStack_1c648._0_12_ = ZEXT812(0);
    auStack_1c648._12_4_ = 0;
    IStack_1c638 = 6;
    auStack_208a8 = (undefined1  [8])auStack_20c44;
    uStack_208a0 = (non_const_type)(auStack_20c44 + 0xc);
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
    auStack_20a98._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_20ae8;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_20ae8;
    auStack_1c668 = (undefined1  [8])auStack_20ae8;
    pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_20ae8;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)&local_8038);
    auStack_1c668._4_4_ =
         fStack_20c30 * (float)auStack_20c44._0_4_ -
         (float)auStack_20c44._8_4_ * (float)auStack_20c44._12_4_;
    auStack_1c668._0_4_ =
         fStack_20c34 * (float)auStack_20c44._8_4_ - (float)auStack_20c44._4_4_ * fStack_20c30;
    vStack_1c660.m_value._0_4_ =
         (float)auStack_20c44._12_4_ * (float)auStack_20c44._4_4_ -
         (float)auStack_20c44._0_4_ * fStack_20c34;
    Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
               (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
    if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
         m_data.array._24_8_ +
         MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
         m_data.array._8_8_ == 6) &&
       (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array._16_8_ == 1)) {
      vStack_1c660.m_value = 3;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = auStack_1c648._8_8_;
      auStack_1c648 = auVar16 << 0x40;
      IStack_1c638 = 6;
      auStack_1c668 = (undefined1  [8])auStack_20ae8;
      pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_20ae8;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_20ae8;
      SVar32 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                           *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                           *)auStack_1c668);
      fVar33 = SQRT(SVar32);
      auVar4._4_4_ = fVar33;
      auVar4._0_4_ = fVar33;
      auVar4._8_4_ = fVar33;
      auVar4._12_4_ = fVar33;
      auStack_20ae8 = divps(auStack_20ae8,auVar4);
      fStack_20ad8 = fStack_20ad8 / fVar33;
      fStack_20ad4 = fStack_20ad4 / fVar33;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[2] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[3] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[4] = 1.4013e-45;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[5] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[6] = 4.2039e-45;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[7] = 0.0;
      vStack_1c660.m_value = 3;
      uStack_1c658 = 1;
      auStack_1c648._0_12_ = ZEXT812(0);
      auStack_1c648._12_4_ = 0;
      IStack_1c638 = 6;
      auStack_208a8 = (undefined1  [8])auStack_20c5c;
      uStack_208a0 = (non_const_type)(auStack_20c5c + 0xc);
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
      auStack_20a98._0_8_ = &MStack_20b08;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array._0_8_ = &MStack_20b08;
      auStack_1c668 = (undefined1  [8])&MStack_20b08;
      pMStack_1c650 = &MStack_20b08;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)&local_8038);
      auStack_1c668._4_4_ =
           fStack_20c48 * (float)auStack_20c5c._0_4_ -
           (float)auStack_20c5c._8_4_ * (float)auStack_20c5c._12_4_;
      auStack_1c668._0_4_ =
           fStack_20c4c * (float)auStack_20c5c._8_4_ - (float)auStack_20c5c._4_4_ * fStack_20c48;
      vStack_1c660.m_value._0_4_ =
           (float)auStack_20c5c._12_4_ * (float)auStack_20c5c._4_4_ -
           (float)auStack_20c5c._0_4_ * fStack_20c4c;
      Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
      if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
           m_data.array._24_8_ +
           MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
           m_data.array._8_8_ == 6) &&
         (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array._16_8_ == 1)) {
        vStack_1c660.m_value = 3;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auStack_1c648._8_8_;
        auStack_1c648 = auVar17 << 0x40;
        IStack_1c638 = 6;
        auStack_1c668 = (undefined1  [8])&MStack_20b08;
        pMStack_1c650 = &MStack_20b08;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b08;
        SVar32 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                             *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)auStack_1c668);
        fVar33 = SQRT(SVar32);
        auVar5._4_4_ = fVar33;
        auVar5._0_4_ = fVar33;
        auVar5._8_4_ = fVar33;
        auVar5._12_4_ = fVar33;
        MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array._0_16_ = divps((undefined1  [16])
                             MStack_20b08.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array._0_16_,auVar5);
        MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[4] = MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[4] / fVar33;
        MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[5] = MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[5] / fVar33;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[3] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[4] = 1.4013e-45;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[5] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[6] = 4.2039e-45;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[7] = 0.0;
        vStack_1c660.m_value = 3;
        uStack_1c658 = 1;
        auStack_1c648._0_12_ = ZEXT812(0);
        auStack_1c648._12_4_ = 0;
        IStack_1c638 = 6;
        auStack_208a8 = (undefined1  [8])auStack_20c74;
        uStack_208a0 = (non_const_type)(auStack_20c74 + 0xc);
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
        auStack_20a98._0_8_ = &MStack_20b28;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array._0_8_ = &MStack_20b28;
        auStack_1c668 = (undefined1  [8])&MStack_20b28;
        pMStack_1c650 = &MStack_20b28;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)&local_8038);
        auStack_1c668._4_4_ =
             fStack_20c60 * (float)auStack_20c74._0_4_ -
             (float)auStack_20c74._8_4_ * (float)auStack_20c74._12_4_;
        auStack_1c668._0_4_ =
             fStack_20c64 * (float)auStack_20c74._8_4_ - (float)auStack_20c74._4_4_ * fStack_20c60;
        vStack_1c660.m_value._0_4_ =
             (float)auStack_20c74._12_4_ * (float)auStack_20c74._4_4_ -
             (float)auStack_20c74._0_4_ * fStack_20c64;
        Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
        if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
             m_data.array._24_8_ +
             MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
             m_data.array._8_8_ == 6) &&
           (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array._16_8_ == 1)) {
          vStack_1c660.m_value = 3;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = auStack_1c648._8_8_;
          auStack_1c648 = auVar18 << 0x40;
          IStack_1c638 = 6;
          auStack_1c668 = (undefined1  [8])&MStack_20b28;
          pMStack_1c650 = &MStack_20b28;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b28;
          SVar32 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                               *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                               *)auStack_1c668);
          fVar33 = SQRT(SVar32);
          auVar6._4_4_ = fVar33;
          auVar6._0_4_ = fVar33;
          auVar6._8_4_ = fVar33;
          auVar6._12_4_ = fVar33;
          MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array._0_16_ = divps((undefined1  [16])
                               MStack_20b28.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array._0_16_,auVar6);
          MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[4] = MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[4] / fVar33;
          MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[5] = MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[5] / fVar33;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[3] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[4] = 1.4013e-45;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[5] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[6] = 4.2039e-45;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[7] = 0.0;
          vStack_1c660.m_value = 3;
          uStack_1c658 = 1;
          auStack_1c648._0_12_ = ZEXT812(0);
          auStack_1c648._12_4_ = 0;
          IStack_1c638 = 6;
          auStack_208a8 = (undefined1  [8])auStack_20c8c;
          uStack_208a0 = (non_const_type)(auStack_20c8c + 0xc);
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
          auStack_20a98._0_8_ = &MStack_20b48;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array._0_8_ = &MStack_20b48;
          auStack_1c668 = (undefined1  [8])&MStack_20b48;
          pMStack_1c650 = &MStack_20b48;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)&local_8038);
          auStack_1c668._4_4_ =
               fStack_20c78 * (float)auStack_20c8c._0_4_ -
               (float)auStack_20c8c._8_4_ * (float)auStack_20c8c._12_4_;
          auStack_1c668._0_4_ =
               fStack_20c7c * (float)auStack_20c8c._8_4_ - (float)auStack_20c8c._4_4_ * fStack_20c78
          ;
          vStack_1c660.m_value._0_4_ =
               (float)auStack_20c8c._12_4_ * (float)auStack_20c8c._4_4_ -
               (float)auStack_20c8c._0_4_ * fStack_20c7c;
          Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                     (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
          if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array._24_8_ +
               MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array._8_8_ == 6) &&
             (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array._16_8_ == 1)) {
            vStack_1c660.m_value = 3;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = auStack_1c648._8_8_;
            auStack_1c648 = auVar19 << 0x40;
            IStack_1c638 = 6;
            auStack_1c668 = (undefined1  [8])&MStack_20b48;
            pMStack_1c650 = &MStack_20b48;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b48;
            SVar32 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                 *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                 *)auStack_1c668);
            fVar33 = SQRT(SVar32);
            auVar7._4_4_ = fVar33;
            auVar7._0_4_ = fVar33;
            auVar7._8_4_ = fVar33;
            auVar7._12_4_ = fVar33;
            MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array._0_16_ =
                 divps((undefined1  [16])
                       MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array._0_16_,auVar7);
            MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[4] =
                 MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[4] / fVar33;
            MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array[5] =
                 MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[5] / fVar33;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[3] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[4] = 1.4013e-45;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[5] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[6] = 4.2039e-45;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[7] = 0.0;
            vStack_1c660.m_value = 3;
            uStack_1c658 = 1;
            auStack_1c648._0_12_ = ZEXT812(0);
            auStack_1c648._12_4_ = 0;
            IStack_1c638 = 6;
            auStack_208a8 = (undefined1  [8])auStack_20ca4;
            uStack_208a0 = (non_const_type)(auStack_20ca4 + 0xc);
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
            auStack_20a98._0_8_ = &MStack_20b68;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array._0_8_ = &MStack_20b68;
            auStack_1c668 = (undefined1  [8])&MStack_20b68;
            pMStack_1c650 = &MStack_20b68;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)&local_8038);
            auStack_1c668._4_4_ =
                 fStack_20c90 * (float)auStack_20ca4._0_4_ -
                 (float)auStack_20ca4._8_4_ * (float)auStack_20ca4._12_4_;
            auStack_1c668._0_4_ =
                 fStack_20c94 * (float)auStack_20ca4._8_4_ -
                 (float)auStack_20ca4._4_4_ * fStack_20c90;
            vStack_1c660.m_value._0_4_ =
                 (float)auStack_20ca4._12_4_ * (float)auStack_20ca4._4_4_ -
                 (float)auStack_20ca4._0_4_ * fStack_20c94;
            Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                       (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
            if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array._24_8_ +
                 MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array._8_8_ == 6) &&
               (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array._16_8_ == 1)) {
              vStack_1c660.m_value = 3;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = auStack_1c648._8_8_;
              auStack_1c648 = auVar20 << 0x40;
              IStack_1c638 = 6;
              auStack_1c668 = (undefined1  [8])&MStack_20b68;
              pMStack_1c650 = &MStack_20b68;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b68;
              SVar32 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                   *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                   *)auStack_1c668);
              fVar33 = SQRT(SVar32);
              auVar8._4_4_ = fVar33;
              auVar8._0_4_ = fVar33;
              auVar8._8_4_ = fVar33;
              auVar8._12_4_ = fVar33;
              MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array._0_16_ =
                   divps((undefined1  [16])
                         MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array._0_16_,auVar8);
              MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[4] =
                   MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[4] / fVar33;
              MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[5] =
                   MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[5] / fVar33;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[2] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[3] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[4] = 1.4013e-45;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[5] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[6] = 4.2039e-45;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[7] = 0.0;
              vStack_1c660.m_value = 3;
              uStack_1c658 = 1;
              auStack_1c648._0_12_ = ZEXT812(0);
              auStack_1c648._12_4_ = 0;
              IStack_1c638 = 6;
              auStack_208a8 = (undefined1  [8])auStack_20cbc;
              uStack_208a0 = (non_const_type)(auStack_20cbc + 0xc);
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
              auStack_20a98._0_8_ = &MStack_20b88;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array._0_8_ = &MStack_20b88;
              auStack_1c668 = (undefined1  [8])&MStack_20b88;
              pMStack_1c650 = &MStack_20b88;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                     *)&local_8038);
              auStack_1c668._4_4_ =
                   fStack_20ca8 * (float)auStack_20cbc._0_4_ -
                   (float)auStack_20cbc._8_4_ * (float)auStack_20cbc._12_4_;
              auStack_1c668._0_4_ =
                   fStack_20cac * (float)auStack_20cbc._8_4_ -
                   (float)auStack_20cbc._4_4_ * fStack_20ca8;
              vStack_1c660.m_value._0_4_ =
                   (float)auStack_20cbc._12_4_ * (float)auStack_20cbc._4_4_ -
                   (float)auStack_20cbc._0_4_ * fStack_20cac;
              Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                         (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
              if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array._24_8_ +
                   MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array._8_8_ == 6) &&
                 (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array._16_8_ == 1)) {
                vStack_1c660.m_value = 3;
                auVar21._8_8_ = 0;
                auVar21._0_8_ = auStack_1c648._8_8_;
                auStack_1c648 = auVar21 << 0x40;
                IStack_1c638 = 6;
                auStack_1c668 = (undefined1  [8])&MStack_20b88;
                pMStack_1c650 = &MStack_20b88;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b88;
                SVar32 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                     *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                     *)auStack_1c668);
                fVar33 = SQRT(SVar32);
                auVar9._4_4_ = fVar33;
                auVar9._0_4_ = fVar33;
                auVar9._8_4_ = fVar33;
                auVar9._12_4_ = fVar33;
                MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array._0_16_ =
                     divps((undefined1  [16])
                           MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array._0_16_,auVar9);
                MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[4] =
                     MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[4] / fVar33;
                MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[5] =
                     MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[5] / fVar33;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[4] = 1.4013e-45;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[5] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[6] = 4.2039e-45;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[7] = 0.0;
                vStack_1c660.m_value = 3;
                uStack_1c658 = 1;
                auStack_1c648._0_12_ = ZEXT812(0);
                auStack_1c648._12_4_ = 0;
                IStack_1c638 = 6;
                auStack_208a8 = (undefined1  [8])auStack_20cd4;
                uStack_208a0 = (non_const_type)(auStack_20cd4 + 0xc);
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
                auStack_20a98._0_8_ = &MStack_20ba8;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array._0_8_ = &MStack_20ba8;
                auStack_1c668 = (undefined1  [8])&MStack_20ba8;
                pMStack_1c650 = &MStack_20ba8;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)&local_8038);
                auStack_1c668._4_4_ =
                     fStack_20cc0 * (float)auStack_20cd4._0_4_ -
                     (float)auStack_20cd4._8_4_ * (float)auStack_20cd4._12_4_;
                auStack_1c668._0_4_ =
                     fStack_20cc4 * (float)auStack_20cd4._8_4_ -
                     (float)auStack_20cd4._4_4_ * fStack_20cc0;
                vStack_1c660.m_value._0_4_ =
                     (float)auStack_20cd4._12_4_ * (float)auStack_20cd4._4_4_ -
                     (float)auStack_20cd4._0_4_ * fStack_20cc4;
                Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                           (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array._24_8_ +
                     MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array._8_8_ == 6) &&
                   (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array._16_8_ == 1)) {
                  vStack_1c660.m_value = 3;
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = auStack_1c648._8_8_;
                  auStack_1c648 = auVar22 << 0x40;
                  IStack_1c638 = 6;
                  auStack_1c668 = (undefined1  [8])&MStack_20ba8;
                  pMStack_1c650 = &MStack_20ba8;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20ba8;
                  SVar32 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                       *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                       *)auStack_1c668);
                  fVar33 = SQRT(SVar32);
                  auVar10._4_4_ = fVar33;
                  auVar10._0_4_ = fVar33;
                  auVar10._8_4_ = fVar33;
                  auVar10._12_4_ = fVar33;
                  MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                  .m_data.array._0_16_ =
                       divps((undefined1  [16])
                             MStack_20ba8.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array._0_16_,auVar10);
                  MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                  .m_data.array[4] =
                       MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[4] / fVar33;
                  MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                  .m_data.array[5] =
                       MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[5] / fVar33;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[4] = 1.4013e-45;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[5] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[6] = 4.2039e-45;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[7] = 0.0;
                  vStack_1c660.m_value = 3;
                  uStack_1c658 = 1;
                  auStack_1c648._0_12_ = ZEXT812(0);
                  auStack_1c648._12_4_ = 0;
                  IStack_1c638 = 6;
                  auStack_208a8 = (undefined1  [8])auStack_20cec;
                  uStack_208a0 = (non_const_type)(auStack_20cec + 0xc);
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
                  auStack_20a98._0_8_ = &MStack_20bc8;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array._0_8_ = &MStack_20bc8;
                  auStack_1c668 = (undefined1  [8])&MStack_20bc8;
                  pMStack_1c650 = &MStack_20bc8;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                         *)&local_8038);
                  auStack_1c668._4_4_ =
                       fStack_20cd8 * (float)auStack_20cec._0_4_ -
                       (float)auStack_20cec._8_4_ * (float)auStack_20cec._12_4_;
                  auStack_1c668._0_4_ =
                       fStack_20cdc * (float)auStack_20cec._8_4_ -
                       (float)auStack_20cec._4_4_ * fStack_20cd8;
                  vStack_1c660.m_value._0_4_ =
                       (float)auStack_20cec._12_4_ * (float)auStack_20cec._4_4_ -
                       (float)auStack_20cec._0_4_ * fStack_20cdc;
                  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                  if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                       m_storage.m_data.array._24_8_ +
                       MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                       m_storage.m_data.array._8_8_ == 6) &&
                     (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array._16_8_ == 1)) {
                    vStack_1c660.m_value = 3;
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = auStack_1c648._8_8_;
                    auStack_1c648 = auVar23 << 0x40;
                    IStack_1c638 = 6;
                    auStack_1c668 = (undefined1  [8])&MStack_20bc8;
                    pMStack_1c650 = &MStack_20bc8;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20bc8;
                    SVar32 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                         *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                         *)auStack_1c668);
                    fVar33 = SQRT(SVar32);
                    auVar11._4_4_ = fVar33;
                    auVar11._0_4_ = fVar33;
                    auVar11._8_4_ = fVar33;
                    auVar11._12_4_ = fVar33;
                    MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array._0_16_ =
                         divps((undefined1  [16])
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array._0_16_,auVar11);
                    MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[4] =
                         MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array[4] / fVar33;
                    MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[5] =
                         MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array[5] / fVar33;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[4] = 1.4013e-45;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[5] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[6] = 4.2039e-45;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[7] = 0.0;
                    vStack_1c660.m_value = 3;
                    uStack_1c658 = 1;
                    auStack_1c648._0_12_ = ZEXT812(0);
                    auStack_1c648._12_4_ = 0;
                    IStack_1c638 = 6;
                    auStack_208a8 = (undefined1  [8])auStack_20d04;
                    uStack_208a0 = (non_const_type)(auStack_20d04 + 0xc);
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
                    auStack_20a98._0_8_ = &MStack_20be8;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array._0_8_ = &MStack_20be8;
                    auStack_1c668 = (undefined1  [8])&MStack_20be8;
                    pMStack_1c650 = &MStack_20be8;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                    Eigen::internal::
                    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                           *)&local_8038);
                    auStack_1c668._4_4_ =
                         fStack_20cf0 * (float)auStack_20d04._0_4_ -
                         (float)auStack_20d04._8_4_ * (float)auStack_20d04._12_4_;
                    auStack_1c668._0_4_ =
                         fStack_20cf4 * (float)auStack_20d04._8_4_ -
                         (float)auStack_20d04._4_4_ * fStack_20cf0;
                    vStack_1c660.m_value._0_4_ =
                         (float)auStack_20d04._12_4_ * (float)auStack_20d04._4_4_ -
                         (float)auStack_20d04._0_4_ * fStack_20cf4;
                    Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                               (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                    if ((MStack_20668.
                         super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array._24_8_ +
                         MStack_20668.
                         super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array._8_8_ == 6) &&
                       (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array._16_8_ == 1)) {
                      vStack_1c660.m_value = 3;
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ = auStack_1c648._8_8_;
                      auStack_1c648 = auVar24 << 0x40;
                      IStack_1c638 = 6;
                      auStack_1c668 = (undefined1  [8])&MStack_20be8;
                      pMStack_1c650 = &MStack_20be8;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20be8;
                      SVar32 = Eigen::internal::
                               redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                               ::
                               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                           *)&local_8038,
                                          (scalar_sum_op<float,_float> *)&MStack_20668,
                                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                           *)auStack_1c668);
                      fVar33 = SQRT(SVar32);
                      auVar12._4_4_ = fVar33;
                      auVar12._0_4_ = fVar33;
                      auVar12._8_4_ = fVar33;
                      auVar12._12_4_ = fVar33;
                      MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array._0_16_ =
                           divps((undefined1  [16])
                                 MStack_20be8.
                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array._0_16_,auVar12);
                      MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[4] =
                           MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[4] / fVar33;
                      MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[5] =
                           MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[5] / fVar33;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[4] = 1.4013e-45;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[5] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[6] = 4.2039e-45;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[7] = 0.0;
                      vStack_1c660.m_value = 3;
                      uStack_1c658 = 1;
                      auStack_1c648._0_12_ = ZEXT812(0);
                      auStack_1c648._12_4_ = 0;
                      IStack_1c638 = 6;
                      auStack_208a8 = (undefined1  [8])auStack_20d1c;
                      uStack_208a0 = (non_const_type)(auStack_20d1c + 0xc);
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
                      auStack_20a98._0_8_ = &MStack_20c08;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array._0_8_ = &MStack_20c08;
                      auStack_1c668 = (undefined1  [8])&MStack_20c08;
                      pMStack_1c650 = &MStack_20c08;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                             *)&local_8038);
                      auStack_1c668._4_4_ =
                           fStack_20d08 * (float)auStack_20d1c._0_4_ -
                           (float)auStack_20d1c._8_4_ * (float)auStack_20d1c._12_4_;
                      auStack_1c668._0_4_ =
                           fStack_20d0c * (float)auStack_20d1c._8_4_ -
                           (float)auStack_20d1c._4_4_ * fStack_20d08;
                      vStack_1c660.m_value._0_4_ =
                           (float)auStack_20d1c._12_4_ * (float)auStack_20d1c._4_4_ -
                           (float)auStack_20d1c._0_4_ * fStack_20d0c;
                      Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                      if ((MStack_20668.
                           super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
                           .m_data.array._24_8_ +
                           MStack_20668.
                           super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
                           .m_data.array._8_8_ == 6) &&
                         (MStack_20668.
                          super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                          m_data.array._16_8_ == 1)) {
                        vStack_1c660.m_value = 3;
                        auVar25._8_8_ = 0;
                        auVar25._0_8_ = auStack_1c648._8_8_;
                        auStack_1c648 = auVar25 << 0x40;
                        IStack_1c638 = 6;
                        auStack_1c668 = (undefined1  [8])&MStack_20c08;
                        pMStack_1c650 = &MStack_20c08;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20c08;
                        SVar32 = Eigen::internal::
                                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                                 ::
                                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                             *)&local_8038,
                                            (scalar_sum_op<float,_float> *)&MStack_20668,
                                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                             *)auStack_1c668);
                        fVar33 = SQRT(SVar32);
                        auVar13._4_4_ = fVar33;
                        auVar13._0_4_ = fVar33;
                        auVar13._8_4_ = fVar33;
                        auVar13._12_4_ = fVar33;
                        MStack_20c08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array._0_16_ =
                             divps((undefined1  [16])
                                   MStack_20c08.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_,auVar13);
                        MStack_20c08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array[4] =
                             MStack_20c08.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[4] / fVar33;
                        MStack_20c08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array[5] =
                             MStack_20c08.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[5] / fVar33;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[2] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[3] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[4] = 1.4013e-45;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[5] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[6] = 4.2039e-45;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[7] = 0.0;
                        vStack_1c660.m_value = 3;
                        uStack_1c658 = 1;
                        auStack_1c648._0_12_ = ZEXT812(0);
                        auStack_1c648._12_4_ = 0;
                        IStack_1c638 = 6;
                        auStack_208a8 = (undefined1  [8])auStack_20d34;
                        uStack_208a0 = (non_const_type)(auStack_20d34 + 0xc);
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20a98;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20948;
                        auStack_20a98._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209a8;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array._0_8_ =
                             (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209a8;
                        auStack_1c668 = (undefined1  [8])auStack_209a8;
                        pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209a8;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                        Eigen::internal::
                        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                               *)&local_8038);
                        auStack_1c668._4_4_ =
                             fStack_20d20 * (float)auStack_20d34._0_4_ -
                             (float)auStack_20d34._8_4_ * (float)auStack_20d34._12_4_;
                        auStack_1c668._0_4_ =
                             fStack_20d24 * (float)auStack_20d34._8_4_ -
                             (float)auStack_20d34._4_4_ * fStack_20d20;
                        vStack_1c660.m_value._0_4_ =
                             (float)auStack_20d34._12_4_ * (float)auStack_20d34._4_4_ -
                             (float)auStack_20d34._0_4_ * fStack_20d24;
                        Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668
                                   ,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668
                                  );
                        if ((MStack_20668.
                             super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array._24_8_ +
                             MStack_20668.
                             super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array._8_8_ == 6) &&
                           (MStack_20668.
                            super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                            m_storage.m_data.array._16_8_ == 1)) {
                          vStack_1c660.m_value = 3;
                          auVar26._8_8_ = 0;
                          auVar26._0_8_ = auStack_1c648._8_8_;
                          auStack_1c648 = auVar26 << 0x40;
                          IStack_1c638 = 6;
                          auStack_1c668 = (undefined1  [8])auStack_209a8;
                          pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209a8;
                          local_8038.
                          super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                          .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_209a8;
                          SVar32 = Eigen::internal::
                                   redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                                   ::
                                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                               *)&local_8038,
                                              (scalar_sum_op<float,_float> *)&MStack_20668,
                                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                               *)auStack_1c668);
                          auVar19 = (undefined1  [16])
                                    MStack_20ac8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar7 = (undefined1  [16])
                                   MStack_20b08.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_;
                          auVar18 = (undefined1  [16])
                                    MStack_20b28.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar6 = (undefined1  [16])
                                   MStack_20b48.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_;
                          auVar17 = (undefined1  [16])
                                    MStack_20b68.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar5 = (undefined1  [16])
                                   MStack_20b88.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_;
                          auVar16 = (undefined1  [16])
                                    MStack_20ba8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar4 = (undefined1  [16])
                                   MStack_20bc8.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_;
                          auVar15 = (undefined1  [16])
                                    MStack_20be8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar3 = (undefined1  [16])
                                   MStack_20c08.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_;
                          fVar33 = SQRT(SVar32);
                          auVar14._4_4_ = fVar33;
                          auVar14._0_4_ = fVar33;
                          auVar14._8_4_ = fVar33;
                          auVar14._12_4_ = fVar33;
                          auStack_209a8 = divps(auStack_209a8,auVar14);
                          fStack_20998 = fStack_20998 / fVar33;
                          fStack_20994 = fStack_20994 / fVar33;
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[1] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[2] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[3] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[4] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[5] =
                               MStack_20ac8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          auStack_20a98._0_8_ = auStack_20ae8._0_8_;
                          auStack_20a98._8_8_ = auStack_20ae8._8_8_;
                          fStack_20a88 = fStack_20ad8;
                          fStack_20a84 = fStack_20ad4;
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[6] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[7] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[8] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[9] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[10] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xb] =
                               MStack_20b08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20a80[0] =
                               MStack_20b28.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20a80[1] =
                               MStack_20b28.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20a78[0] =
                               MStack_20b28.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20a78[1] =
                               MStack_20b28.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          fStack_20a70 = MStack_20b28.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[4];
                          fStack_20a6c = MStack_20b28.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[5];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xc] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xd] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xe] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xf] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x10] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x11] =
                               MStack_20b48.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20a68[0] =
                               MStack_20b68.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20a68[1] =
                               MStack_20b68.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20a60[0] =
                               MStack_20b68.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20a60[1] =
                               MStack_20b68.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          fStack_20a58 = MStack_20b68.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[4];
                          fStack_20a54 = MStack_20b68.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[5];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x12] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x13] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x14] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x15] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x16] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x17] =
                               MStack_20b88.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20a50[0] =
                               MStack_20ba8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20a50[1] =
                               MStack_20ba8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20a48[0] =
                               MStack_20ba8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20a48[1] =
                               MStack_20ba8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          fStack_20a40 = MStack_20ba8.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[4];
                          fStack_20a3c = MStack_20ba8.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[5];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x18] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x19] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1a] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1b] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1c] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1d] =
                               MStack_20bc8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20a38[0] =
                               MStack_20be8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20a38[1] =
                               MStack_20be8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20a30[0] =
                               MStack_20be8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20a30[1] =
                               MStack_20be8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          fStack_20a28 = MStack_20be8.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[4];
                          fStack_20a24 = MStack_20be8.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[5];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1e] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1f] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x20] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x21] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x22] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20948.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x23] =
                               MStack_20c08.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          auStack_20a20 = auStack_209a8;
                          fStack_20a10 = fStack_20998;
                          fStack_20a0c = fStack_20994;
                          vStack_209c8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_209c8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_209c8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_209e8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_209e8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_209e8.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          lVar29 = 0x14;
                          MStack_20c08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar3;
                          MStack_20be8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar15;
                          MStack_20bc8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar4;
                          MStack_20ba8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar16;
                          MStack_20b88.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar5;
                          MStack_20b68.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar17;
                          MStack_20b48.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar6;
                          MStack_20b28.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar18;
                          MStack_20b08.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar7;
                          MStack_20ac8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar19;
                          do {
                            auStack_1c668 = *(undefined1 (*) [8])(auStack_20aac + lVar29);
                            vStack_1c660.m_value = *(long *)(auStack_20aa4 + lVar29);
                            uStack_1c658 = *(undefined8 *)(auStack_20a9c + lVar29);
                            if (vStack_209c8.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_209c8.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                                          *)&vStack_209c8,
                                         (iterator)
                                         vStack_209c8.
                                         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<float,_6,_1,_0,_6,_1> *)auStack_1c668);
                            }
                            else {
                              pDVar27 = &((vStack_209c8.
                                           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         ).m_storage;
                              (pDVar27->m_data).array[4] = (float)(int)uStack_1c658;
                              (pDVar27->m_data).array[5] = (float)SUB84(uStack_1c658,4);
                              *(undefined1 (*) [8])
                               ((vStack_209c8.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                               m_storage.m_data.array = auStack_1c668;
                              *(long *)(((vStack_209c8.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage.m_data.array + 2) = vStack_1c660.m_value;
                              vStack_209c8.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_209c8.
                                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            auStack_1c668 = *(undefined1 (*) [8])(auStack_20988 + lVar29 + 0x2c);
                            vStack_1c660.m_value = *(long *)(auStack_20988 + lVar29 + 0x34);
                            uStack_1c658 = *(undefined8 *)(auStack_20988 + lVar29 + 0x3c);
                            if (vStack_209e8.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_209e8.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                                          *)&vStack_209e8,
                                         (iterator)
                                         vStack_209e8.
                                         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<float,_6,_1,_0,_6,_1> *)auStack_1c668);
                            }
                            else {
                              pDVar27 = &((vStack_209e8.
                                           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         ).m_storage;
                              (pDVar27->m_data).array[4] = (float)(int)uStack_1c658;
                              (pDVar27->m_data).array[5] = (float)SUB84(uStack_1c658,4);
                              *(undefined1 (*) [8])
                               ((vStack_209e8.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                               m_storage.m_data.array = auStack_1c668;
                              *(long *)(((vStack_209e8.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage.m_data.array + 2) = vStack_1c660.m_value;
                              vStack_209e8.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_209e8.
                                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            lVar29 = lVar29 + 0x18;
                          } while (lVar29 != 0xa4);
                          memset(&MStack_20668,0,0x4000);
                          setupAction<float>(&vStack_209c8,&vStack_209e8,&MStack_20668);
                          auStack_20988._0_4_ = 1.0;
                          auStack_20988._4_4_ = 0.0;
                          auStack_20988._8_4_ = 0.0;
                          auStack_20988._12_4_ = 0.0;
                          auStack_20988._16_4_ = 0.0;
                          auStack_20988._20_4_ = 1.0;
                          auStack_20988._24_4_ = 0.0;
                          auStack_20988._28_4_ = 0.0;
                          auStack_20988._32_4_ = 0.0;
                          auStack_20988._36_4_ = 0.0;
                          auStack_20988._40_4_ = 1.0;
                          auStack_20988._44_4_ = 0.0;
                          auStack_20988._48_4_ = 0.0;
                          auStack_20988._52_4_ = 0.0;
                          auStack_20988._56_4_ = 0.0;
                          auStack_20988._60_4_ = 1.0;
                          local_c158 = false;
                          local_c144._0_1_ = false;
                          local_c144._1_1_ = false;
                          memset(auStack_18668,0,0x202);
                          local_c140 = -1;
                          Eigen::EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>::
                          compute<Eigen::Matrix<float,64,64,0,64,64>>
                                    ((EigenSolver<Eigen::Matrix<float,64,64,0,64,64>> *)
                                     auStack_1c668,
                                     (EigenBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)
                                     &MStack_20668,true);
                          Eigen::EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::eigenvectors
                                    (&local_8038,
                                     (EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)
                                     auStack_1c668);
                          std::
                          vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ::reserve(__return_storage_ptr__,0x40);
                          stack0xfffffffffffdf560 =
                               local_8038.
                               super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                               .m_storage.m_data.array + 0x3c;
                          lVar29 = 0;
                          bVar31 = false;
                          do {
                            stack0xfffffffffffdf558 = lVar29;
                            lVar29 = 0;
                            do {
                              uVar35 = __divsc3(stack0xfffffffffffdf560[lVar29]._M_value,
                                                (int)(stack0xfffffffffffdf560[lVar29]._M_value >>
                                                     0x20));
                              MStack_20704.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array[lVar29] = (float)uVar35;
                              if (1e-06 <= ABS((float)((ulong)uVar35 >> 0x20))) {
                                bVar31 = true;
                              }
                              if (NAN((float)uVar35)) {
                                bVar31 = true;
                              }
                              lVar29 = lVar29 + 1;
                            } while (lVar29 != 3);
                            if (bVar31) {
                              bVar31 = false;
                              lVar29 = stack0xfffffffffffdf558;
                            }
                            else {
                              cayley2rot<float>(&MStack_20704);
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[0] = (float)auStack_208b0._0_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[1] = (float)auStack_208a8._4_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[2] = (float)uStack_20898;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[3] = (float)auStack_208b0._4_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[4] = (float)uStack_208a0;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[5] = uStack_20898._4_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[6] = (float)auStack_208a8._0_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[7] = uStack_208a0._4_4_;
                              MStack_20c2c.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[8] = pfStack_20890._0_4_;
                              lVar30 = 0;
                              lVar29 = 0;
                              do {
                                pfStack_20890 = (PointerType)(auStack_20a98 + lVar30);
                                pfStack_20840 =
                                     (PointerType)
                                     ((long)MStack_20948.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar30);
                                auStack_208a8 = (undefined1  [8])(auStack_20a98 + lVar30 + 0xc);
                                pfStack_20778 =
                                     (PointerType)
                                     ((long)MStack_20948.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar30 + 0xc);
                                uStack_208a0 = (non_const_type)0x3;
                                pMStack_20880 = (XprTypeNested)auStack_20a98;
                                vStack_20878.m_value = 0;
                                IStack_20868 = 6;
                                vStack_20860.m_value = 3;
                                IStack_20850 = 6;
                                pMStack_20848 = &MStack_20c2c;
                                vStack_20838.m_value = 3;
                                pMStack_20818 = &MStack_20948;
                                vStack_20810.m_value = 0;
                                IStack_20800 = 6;
                                vStack_207f8.m_value = 0;
                                IStack_207e8 = 6;
                                vStack_207d8.m_value = 3;
                                vStack_207b0.m_value = 0;
                                IStack_207a0 = 6;
                                vStack_20798.m_value = 0;
                                IStack_20788 = 6;
                                vStack_20770.m_value = 3;
                                vStack_20748.m_value = 0;
                                IStack_20738 = 6;
                                vStack_20730.m_value = 3;
                                IStack_20720 = 6;
                                vStack_20870.m_value = lVar29;
                                pfStack_20828 = pfStack_20840;
                                vStack_20808.m_value = lVar29;
                                pfStack_207e0 = pfStack_20890;
                                pfStack_207c8 = pfStack_20890;
                                pMStack_207b8 = pMStack_20880;
                                vStack_207a8.m_value = lVar29;
                                pMStack_20780 = pMStack_20848;
                                pfStack_20760 = pfStack_20840;
                                pMStack_20750 = pMStack_20818;
                                vStack_20740.m_value = lVar29;
                                Eigen::internal::
                                binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                                ::Data::Data((Data *)(auStack_206f8 + 8),(XprType *)auStack_208a8);
                                MStack_206c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[lVar29] = -(*pfStack_206e8 + *pfStack_206d8);
                                fVar33 = *(float *)((long)MStack_20948.
                                                                                                                    
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar30);
                                fVar1 = *(float *)((long)MStack_20948.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar30 + 4);
                                fVar2 = *(float *)((long)MStack_20948.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar30 + 8);
                                fVar36 = MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[8] * fVar2 +
                                         MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[5] * fVar1 +
                                         MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[2] * fVar33;
                                fVar37 = MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[7] * fVar2 +
                                         MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[4] * fVar1 +
                                         MStack_20c2c.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[1] * fVar33;
                                fVar34 = fVar2 * MStack_20c2c.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[6] +
                                         fVar1 * MStack_20c2c.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[3] +
                                         fVar33 * MStack_20c2c.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0];
                                fVar33 = *(float *)(auStack_20a98 + lVar30 + 8);
                                fVar1 = *(float *)(auStack_20a98 + lVar30);
                                fVar2 = *(float *)(auStack_20a98 + lVar30 + 4);
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar29] = fVar33 * fVar37 - fVar36 * fVar2;
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar29 + 6] =
                                     fVar36 * fVar1 - fVar33 * fVar34;
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar29 + 0xc] =
                                     fVar34 * fVar2 - fVar37 * fVar1;
                                lVar29 = lVar29 + 1;
                                lVar30 = lVar30 + 0x18;
                              } while (lVar30 != 0x90);
                              auStack_208b0 = (undefined1  [8])&MStack_206b0;
                              uStack_20898 = &MStack_206c8;
                              auStack_208a8 = auStack_208b0;
                              uStack_208a0 = (non_const_type)auStack_208b0;
                              Eigen::internal::
                              call_dense_assignment_loop<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,0>,Eigen::Matrix<float,6,1,0,6,1>,1>,Eigen::internal::assign_op<float,float>>
                                        ((Matrix<float,_3,_1,_0,_3,_1> *)auStack_206f8,
                                         (Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>
                                          *)auStack_208b0,&aStack_20d35);
                              lVar29 = stack0xfffffffffffdf558;
                              lVar30 = 0;
                              pfVar28 = (float *)&MStack_20c2c;
                              do {
                                *(float *)(auStack_20988 + lVar30 + 8) = pfVar28[2];
                                *(undefined8 *)(auStack_20988 + lVar30) = *(undefined8 *)pfVar28;
                                pfVar28 = pfVar28 + 3;
                                lVar30 = lVar30 + 0x10;
                              } while (lVar30 != 0x30);
                              auStack_20988._48_4_ = auStack_206f8._0_4_;
                              auStack_20988._52_4_ = auStack_206f8._4_4_;
                              auStack_20988._56_4_ = auStack_206f8._8_4_;
                              __position._M_current =
                                   (__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                              if (__position._M_current ==
                                  (__return_storage_ptr__->
                                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::
                                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                            *)__return_storage_ptr__,__position,
                                           (Matrix<float,_4,_4,_0,_4,_4> *)auStack_20988);
                              }
                              else {
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 0xc) =
                                     CONCAT44(auStack_206f8._4_4_,auStack_206f8._0_4_);
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 0xe) =
                                     CONCAT44(auStack_20988._60_4_,auStack_206f8._8_4_);
                                *(undefined8 *)
                                 (((__position._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array + 8) = auStack_20988._32_8_;
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 10) =
                                     CONCAT44(auStack_20988._44_4_,auStack_20988._40_4_);
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 4) =
                                     CONCAT44(auStack_20988._20_4_,auStack_20988._16_4_);
                                *(undefined8 *)
                                 (((__position._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array + 6) = auStack_20988._24_8_;
                                *(ulong *)((__position._M_current)->
                                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                          ).m_storage.m_data.array =
                                     CONCAT44(auStack_20988._4_4_,auStack_20988._0_4_);
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 2) =
                                     CONCAT44(auStack_20988._12_4_,auStack_20988._8_4_);
                                (__return_storage_ptr__->
                                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish =
                                     __position._M_current + 1;
                              }
                            }
                            lVar29 = lVar29 + 1;
                            stack0xfffffffffffdf560 = stack0xfffffffffffdf560 + 0x40;
                          } while (lVar29 != 0x40);
                          if (vStack_209e8.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_209e8.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (vStack_209c8.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_209c8.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          return __return_storage_ptr__;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 6, 1>>::finished() [MatrixType = Eigen::Matrix<float, 6, 1>]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}